

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserOpenSim.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChParserOpenSim::Parse(ChParserOpenSim *this,ChSystem *system,string *filename)

{
  pointer *ppdVar1;
  _func_int **pp_Var2;
  pointer *ppcVar3;
  pointer pdVar4;
  pointer pdVar5;
  char cVar6;
  long *plVar7;
  undefined8 *puVar8;
  xml_node<char> *pxVar9;
  xml_node<char> *pxVar10;
  ostream *poVar11;
  ChLoadContainer *pCVar12;
  long *plVar13;
  _func_int **pp_Var14;
  undefined8 uVar15;
  char *pcVar16;
  shared_ptr<chrono::ChLoadContainer> loadcontainer;
  vector<double,_std::allocator<double>_> elems;
  file<char> file;
  path filepath;
  xml_document<char> doc;
  ChLoadContainer *pCStack_101a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10198;
  undefined1 auStack_10190 [24];
  undefined8 uStack_10178;
  pointer pdStack_10170;
  undefined8 uStack_10168;
  file<char> fStack_10160;
  long lStack_10148;
  shared_ptr<chrono::ChLoadContainer> sStack_10140;
  shared_ptr<chrono::ChPhysicsItem> sStack_10130;
  string sStack_10120;
  string sStack_10100;
  path pStack_100e0;
  undefined1 auStack_100b8 [32];
  xml_node<char> *pxStack_10098;
  node_type nStack_10090;
  xml_node<char> *pxStack_10088;
  xml_attribute<char> *pxStack_10078;
  memory_pool<char> mStack_10058;
  
  filesystem::path::path(&pStack_100e0,filename);
  filesystem::path::parent_path((path *)auStack_100b8,&pStack_100e0);
  filesystem::path::str_abi_cxx11_(&sStack_10100,(path *)auStack_100b8,native_path);
  plVar7 = (long *)std::__cxx11::string::append((char *)&sStack_10100);
  pCVar12 = (ChLoadContainer *)(plVar7 + 2);
  if ((ChLoadContainer *)*plVar7 == pCVar12) {
    auStack_10190._0_8_ = (pCVar12->super_ChPhysicsItem).super_ChObj._vptr_ChObj;
    auStack_10190._8_8_ = plVar7[3];
    pCStack_101a0 = (ChLoadContainer *)auStack_10190;
  }
  else {
    auStack_10190._0_8_ = (pCVar12->super_ChPhysicsItem).super_ChObj._vptr_ChObj;
    pCStack_101a0 = (ChLoadContainer *)*plVar7;
  }
  _Stack_10198._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar7[1];
  *plVar7 = (long)pCVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  filesystem::path::stem_abi_cxx11_(&sStack_10120,&pStack_100e0);
  pp_Var2 = (_func_int **)
            ((long)&(_Stack_10198._M_pi)->_vptr__Sp_counted_base + sStack_10120._M_string_length);
  pp_Var14 = (_func_int **)0xf;
  if (pCStack_101a0 != (ChLoadContainer *)auStack_10190) {
    pp_Var14 = (_func_int **)auStack_10190._0_8_;
  }
  if (pp_Var14 < pp_Var2) {
    uVar15 = (_func_int **)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_10120._M_dataplus._M_p != &sStack_10120.field_2) {
      uVar15 = sStack_10120.field_2._M_allocated_capacity;
    }
    if (pp_Var2 <= (ulong)uVar15) {
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&sStack_10120,0,(char *)0x0,(ulong)pCStack_101a0);
      goto LAB_00957ed2;
    }
  }
  puVar8 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&pCStack_101a0,(ulong)sStack_10120._M_dataplus._M_p);
LAB_00957ed2:
  auStack_10190._16_8_ = &pdStack_10170;
  ppdVar1 = (pointer *)(puVar8 + 2);
  if ((pointer *)*puVar8 == ppdVar1) {
    pdStack_10170 = *ppdVar1;
    uStack_10168 = puVar8[3];
  }
  else {
    pdStack_10170 = *ppdVar1;
    auStack_10190._16_8_ = (pointer *)*puVar8;
  }
  uStack_10178 = puVar8[1];
  *puVar8 = ppdVar1;
  puVar8[1] = 0;
  *(undefined1 *)ppdVar1 = 0;
  plVar7 = (long *)std::__cxx11::string::append(auStack_10190 + 0x10);
  ppcVar3 = &fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  plVar13 = plVar7 + 2;
  if ((pointer *)*plVar7 == (pointer *)plVar13) {
    fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
    lStack_10148 = plVar7[3];
    fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppcVar3;
  }
  else {
    fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar13;
    fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)*plVar7;
  }
  fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar7[1];
  *plVar7 = (long)plVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->m_datapath,(string *)&fStack_10160);
  if ((pointer *)
      fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != ppcVar3) {
    operator_delete(fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if ((pointer *)auStack_10190._16_8_ != &pdStack_10170) {
    operator_delete((void *)auStack_10190._16_8_,(long)pdStack_10170 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10120._M_dataplus._M_p != &sStack_10120.field_2) {
    operator_delete(sStack_10120._M_dataplus._M_p,sStack_10120.field_2._M_allocated_capacity + 1);
  }
  if (pCStack_101a0 != (ChLoadContainer *)auStack_10190) {
    operator_delete(pCStack_101a0,auStack_10190._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_10100._M_dataplus._M_p != &sStack_10100.field_2) {
    operator_delete(sStack_10100._M_dataplus._M_p,sStack_10100.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(auStack_100b8 + 8));
  rapidxml::file<char>::file(&fStack_10160,(filename->_M_dataplus)._M_p);
  pxStack_10098 = (xml_node<char> *)0x0;
  auStack_100b8._0_8_ = (char *)0x0;
  auStack_100b8._8_8_ = (pointer)0x0;
  nStack_10090 = node_document;
  pxStack_10088 = (xml_node<char> *)0x0;
  pxStack_10078 = (xml_attribute<char> *)0x0;
  mStack_10058.m_end = (char *)&mStack_10058.m_alloc_func;
  mStack_10058.m_begin = mStack_10058.m_static_memory;
  mStack_10058.m_alloc_func = (alloc_func *)0x0;
  mStack_10058.m_free_func = (free_func *)0x0;
  mStack_10058.m_ptr = mStack_10058.m_begin;
  rapidxml::xml_document<char>::parse<0>
            ((xml_document<char> *)auStack_100b8,
             fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  pxVar9 = rapidxml::xml_node<char>::first_node(pxStack_10088,"Model",0,true);
  pxVar9 = rapidxml::xml_node<char>::first_node(pxVar9,"gravity",0,true);
  pcVar16 = (pxVar9->super_xml_base<char>).m_value;
  if (pcVar16 == (char *)0x0) {
    pcVar16 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  strToSTLVector<double>((vector<double,_std::allocator<double>_> *)(auStack_10190 + 0x10),pcVar16);
  pdVar4 = *(pointer *)(auStack_10190._16_8_ + 0x10);
  pdVar5 = *(pointer *)(auStack_10190._16_8_ + 8);
  (system->G_acc).m_data[0] = (double)*(pointer *)auStack_10190._16_8_;
  (system->G_acc).m_data[1] = (double)pdVar5;
  (system->G_acc).m_data[2] = (double)pdVar4;
  pxVar9 = rapidxml::xml_node<char>::first_node(pxStack_10088,"Model",0,true);
  pxVar9 = rapidxml::xml_node<char>::first_node(pxVar9,"BodySet",0,true);
  if ((pxVar9 == (xml_node<char> *)0x0) &&
     (pxVar10 = rapidxml::xml_node<char>::first_node((xml_node<char> *)0x0,"objects",0,true),
     pxVar10 != (xml_node<char> *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No body set detected for this model.",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
  }
  else {
    pxVar9 = rapidxml::xml_node<char>::first_node(pxVar9,"objects",0,true);
    for (pxVar9 = pxVar9->m_first_node; pxVar9 != (xml_node<char> *)0x0;
        pxVar9 = pxVar9->m_next_sibling) {
      parseBody(this,pxVar9,system);
      if ((pxVar9->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) goto LAB_00958442;
    }
    pCStack_101a0 = (ChLoadContainer *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChLoadContainer,std::allocator<chrono::ChLoadContainer>>
              (&_Stack_10198,&pCStack_101a0,(allocator<chrono::ChLoadContainer> *)&sStack_10100);
    sStack_10130.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &pCStack_101a0->super_ChPhysicsItem;
    sStack_10130.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_10198._M_pi;
    if (_Stack_10198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_10198._M_pi)->_M_use_count = (_Stack_10198._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_10198._M_pi)->_M_use_count = (_Stack_10198._M_pi)->_M_use_count + 1;
      }
    }
    ChSystem::Add(system,&sStack_10130);
    if (sStack_10130.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (sStack_10130.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    pxVar9 = rapidxml::xml_node<char>::first_node(pxStack_10088,"Model",0,true);
    pxVar9 = rapidxml::xml_node<char>::first_node(pxVar9,"ForceSet",0,true);
    if ((pxVar9 == (xml_node<char> *)0x0) ||
       (pxVar10 = rapidxml::xml_node<char>::first_node(pxVar9,"objects",0,true),
       pxVar10 == (xml_node<char> *)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No forces detected.",0x13);
      cVar6 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      pcVar16 = (char *)(ulong)(uint)(int)cVar6;
      std::ostream::put(-0x20);
      std::ostream::flush();
    }
    else {
      poVar11 = std::ostream::_M_insert<void_const*>(&std::cout);
      rapidxml::xml_node<char>::first_node(pxVar9,"objects",0,true);
      poVar11 = std::ostream::_M_insert<void_const*>(poVar11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      pcVar16 = "objects";
      pxVar9 = rapidxml::xml_node<char>::first_node(pxVar9,"objects",0,true);
      pxVar9 = pxVar9->m_first_node;
      if (pxVar9 != (xml_node<char> *)0x0) {
        do {
          sStack_10140.super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = pCStack_101a0;
          sStack_10140.super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_10198._M_pi;
          if (_Stack_10198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_10198._M_pi)->_M_use_count = (_Stack_10198._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_10198._M_pi)->_M_use_count = (_Stack_10198._M_pi)->_M_use_count + 1;
            }
          }
          pcVar16 = (char *)pxVar9;
          parseForce(this,pxVar9,system,&sStack_10140);
          if (sStack_10140.super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (sStack_10140.
                       super___shared_ptr<chrono::ChLoadContainer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((pxVar9->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
LAB_00958442:
            __assert_fail("this->m_parent",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/rapidxml/rapidxml.hpp"
                          ,0x3ee,
                          "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                         );
          }
          pxVar9 = pxVar9->m_next_sibling;
        } while (pxVar9 != (xml_node<char> *)0x0);
      }
    }
    initShapes(this,(xml_node<char> *)pcVar16,system);
    if (_Stack_10198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_10198._M_pi);
    }
  }
  if ((pointer *)auStack_10190._16_8_ != (pointer *)0x0) {
    operator_delete((void *)auStack_10190._16_8_,(long)pdStack_10170 - auStack_10190._16_8_);
  }
  rapidxml::memory_pool<char>::clear(&mStack_10058);
  if ((pointer *)
      fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)fStack_10160.m_data.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pStack_100e0.m_path);
  return;
}

Assistant:

void ChParserOpenSim::Parse(ChSystem& system, const std::string& filename) {
    // Use the model name as the directory for obj files. For example,
    // the osim file opensim/Rajagopal2015.osim should have the referenced obj
    // files sitting in data/opensim/Rajagopal2015/
    // Use filesystem for path parsing, we should probably use the library more
    path filepath(filename);
    // Set the member path so when we load meshes we can find them
    // Strip the parent and stem to use as directory for data files
    m_datapath = filepath.parent_path().str() + "/" + filepath.stem() + "/";

    rapidxml::file<char> file(filename.c_str());

    xml_document<> doc;
    doc.parse<0>(file.data());

    // Get gravity from model and set it in system
    auto elems = strToSTLVector<double>(doc.first_node()->first_node("Model")->first_node("gravity")->value());
    system.Set_G_acc(ChVector<>(elems[0], elems[1], elems[2]));

    // Traverse the list of bodies and parse the information for each one
    xml_node<>* bodySet = doc.first_node()->first_node("Model")->first_node("BodySet");
    if (bodySet == NULL && bodySet->first_node("objects") != NULL) {
        std::cout << "No body set detected for this model." << std::endl;
        return;
    }
    xml_node<>* bodyNode = bodySet->first_node("objects")->first_node();
    while (bodyNode != NULL) {
        parseBody(bodyNode, system);
        bodyNode = bodyNode->next_sibling();
    }

    ////xml_node<>* controllerSet =
    ////    doc.first_node()->first_node("Model")->first_node("ControllerSet")->first_node("objects");
    ////xml_node<>* controllerNode = controllerSet->first_node();
    ////while (controllerNode != NULL) {
    ////    auto actuators = strToSTLVector<std::string>(controllerNode->first_node("actuator_list")->value());
    ////    controllerNode = controllerNode->next_sibling();
    ////    // Read function as controllerNode->first_node("FunctionSet")
    ////}

    auto loadcontainer = chrono_types::make_shared<ChLoadContainer>();
    system.Add(loadcontainer);

    xml_node<>* forceSet = doc.first_node()->first_node("Model")->first_node("ForceSet");
    if (forceSet != NULL && forceSet->first_node("objects") != NULL) {
        std::cout << forceSet << forceSet->first_node("objects") << std::endl;
        xml_node<>* forceNode = forceSet->first_node("objects")->first_node();
        while (forceNode != NULL) {
            parseForce(forceNode, system, loadcontainer);
            forceNode = forceNode->next_sibling();
        }
    } else {
        std::cout << "No forces detected." << std::endl;
    }

    initShapes(bodyNode, system);
}